

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ark_MRIStepInnerEvolve(MRIStepInnerStepper stepper,sunrealtype t0,sunrealtype tout,N_Vector y)

{
  int iVar1;
  int iVar2;
  sunrealtype *unaff_retaddr;
  int retval;
  int nforcing;
  N_Vector *forcing;
  sunrealtype tscale;
  sunrealtype tshift;
  sunrealtype tret;
  ARKodeMem ark_mem;
  void *arkode_mem;
  MRIStepInnerStepper in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  sunrealtype *in_stack_ffffffffffffffa8;
  sunrealtype *in_stack_ffffffffffffffb0;
  MRIStepInnerStepper in_stack_ffffffffffffffb8;
  long local_30;
  int in_stack_fffffffffffffffc;
  
  iVar1 = MRIStepInnerStepper_GetContent(in_stack_ffffffffffffff98,(void **)0x1a32c9);
  if (iVar1 == 0) {
    if (local_30 == 0) {
      arkProcessError((ARKodeMem)0x0,-0x15,0xef8,"ark_MRIStepInnerEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"arkode_mem = NULL illegal.");
      iVar1 = -1;
    }
    else {
      iVar1 = MRIStepInnerStepper_GetForcingData
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8,
                         (N_Vector **)((ulong)in_stack_ffffffffffffffa4 << 0x20),
                         (int *)in_stack_ffffffffffffff98);
      if (iVar1 == 0) {
        iVar1 = (**(code **)(local_30 + 0x228))
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,local_30,
                           in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
        if (iVar1 == 0) {
          iVar1 = ARKodeSetStopTime(in_stack_ffffffffffffffa8,
                                    (sunrealtype)((ulong)in_stack_ffffffffffffffa4 << 0x20));
          if (iVar1 == 0) {
            iVar1 = ARKodeEvolve((void *)tscale,(sunrealtype)forcing,_retval,unaff_retaddr,
                                 in_stack_fffffffffffffffc);
            if (0 < iVar1) {
              iVar1 = 0;
            }
            if (iVar1 < 0) {
              if (((iVar1 != -1) && (iVar1 != -4)) && (iVar1 != -3)) {
                return -1;
              }
              iVar1 = 1;
            }
            iVar2 = (**(code **)(local_30 + 0x228))(0,0x3ff0000000000000,local_30,0,0);
            if (iVar2 != 0) {
              iVar1 = -1;
            }
          }
          else {
            iVar1 = -1;
          }
        }
        else {
          iVar1 = -1;
        }
      }
      else {
        iVar1 = -1;
      }
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ark_MRIStepInnerEvolve(MRIStepInnerStepper stepper,
                           SUNDIALS_MAYBE_UNUSED sunrealtype t0,
                           sunrealtype tout, N_Vector y)
{
  void* arkode_mem; /* arkode memory             */
  ARKodeMem ark_mem;
  sunrealtype tret;           /* return time               */
  sunrealtype tshift, tscale; /* time normalization values */
  N_Vector* forcing;          /* forcing vectors           */
  int nforcing;               /* number of forcing vectors */
  int retval;                 /* return value              */

  /* extract the ARKODE memory struct */
  retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return -1; }
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return -1;
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* get the forcing data */
  retval = MRIStepInnerStepper_GetForcingData(stepper, &tshift, &tscale,
                                              &forcing, &nforcing);
  if (retval != ARK_SUCCESS) { return -1; }

  /* set the inner forcing data */
  retval = ark_mem->step_setforcing(ark_mem, tshift, tscale, forcing, nforcing);
  if (retval != ARK_SUCCESS) { return -1; }

  /* set the stop time */
  retval = ARKodeSetStopTime(arkode_mem, tout);
  if (retval != ARK_SUCCESS) { return -1; }

  /* evolve inner ODE, consider all positive return values as 'success' */
  retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);
  if (retval > 0) { retval = 0; }

  /* set a recoverable failure for a few ARKODE failure modes;
     on other ARKODE errors return with an unrecoverable failure */
  if (retval < 0)
  {
    if ((retval == ARK_TOO_MUCH_WORK) || (retval == ARK_CONV_FAILURE) ||
        (retval == ARK_ERR_FAILURE))
    {
      retval = 1;
    }
    else { return -1; }
  }

  /* disable inner forcing */
  if (ark_mem->step_setforcing(ark_mem, ZERO, ONE, NULL, 0) != ARK_SUCCESS)
  {
    return -1;
  }

  return retval;
}